

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall GraphBuilder::printEdges(GraphBuilder *this,ostream *ostream)

{
  value_type pNVar1;
  bool bVar2;
  _Node_const_iterator<Node_*,_true,_false> *this_00;
  undefined8 in_RSI;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *in_RDI;
  value_type *iterator_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
  *__range1_1;
  value_type *iterator;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *__range1;
  _Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<Node_*,_false> local_48;
  _Node_iterator_base<Node_*,_false> local_40;
  size_type *local_38;
  reference local_30;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_20;
  size_type *local_18;
  undefined8 local_10;
  
  local_18 = &in_RDI[1]._M_h._M_bucket_count;
  local_10 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::begin(in_RDI);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    local_30 = std::__detail::
               _Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
                            *)0x1945ed);
    (*local_30->second->_vptr_Node[4])(local_30->second,local_10);
    std::__detail::
    _Node_const_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>::
    operator++(in_stack_ffffffffffffffb0);
  }
  local_38 = &(((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                 *)in_RDI)->_M_h)._M_bucket_count;
  local_40._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::begin((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                *)in_RDI);
  local_48._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::end((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
              *)in_RDI);
  while( true ) {
    bVar2 = std::__detail::operator!=(&local_40,&local_48);
    if (!bVar2) break;
    this_00 = (_Node_const_iterator<Node_*,_true,_false> *)
              std::__detail::_Node_const_iterator<Node_*,_true,_false>::operator*
                        ((_Node_const_iterator<Node_*,_true,_false> *)0x19465c);
    pNVar1 = (value_type)(this_00->super__Node_iterator_base<Node_*,_false>)._M_cur;
    (*pNVar1->_vptr_Node[4])(pNVar1,local_10);
    std::__detail::_Node_const_iterator<Node_*,_true,_false>::operator++(this_00);
  }
  return;
}

Assistant:

void GraphBuilder::printEdges(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        iterator.second->printOutcomingEdges(ostream);
    }
    for (const auto &iterator : artificialNodes_) {
        iterator->printOutcomingEdges(ostream);
    }
}